

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpio.c
# Opt level: O1

int file_to_archive(cpio *cpio,char *srcpath)

{
  byte *pbVar1;
  char cVar2;
  size_t sVar3;
  byte *pbVar4;
  int iVar5;
  mode_t extraout_EAX;
  mode_t extraout_EAX_00;
  mode_t mVar6;
  mode_t extraout_EAX_01;
  mode_t extraout_EAX_02;
  mode_t extraout_EAX_03;
  int extraout_EAX_04;
  char *pcVar7;
  size_t sVar8;
  ulong uVar9;
  ulong uVar10;
  byte *__src;
  bool bVar11;
  archive_entry *entry;
  archive_entry *spare;
  archive_entry *local_30;
  archive_entry *local_28;
  
  local_30 = archive_entry_new();
  if (local_30 == (archive_entry *)0x0) {
    pcVar7 = "Couldn\'t allocate entry";
    iVar5 = 0;
LAB_0010b327:
    lafe_errc(1,iVar5,pcVar7);
  }
  archive_entry_copy_sourcepath(local_30,srcpath);
  iVar5 = archive_read_disk_entry_from_file(cpio->archive_read_disk,local_30,-1,(stat *)0x0);
  if (iVar5 < -0x19) {
    pcVar7 = archive_error_string(cpio->archive_read_disk);
    lafe_errc(1,0,"%s",pcVar7);
  }
  if (iVar5 < 0) {
    pcVar7 = archive_error_string(cpio->archive_read_disk);
    lafe_warnc(0,"%s",pcVar7);
  }
  if (iVar5 == -0x19) {
    archive_entry_free(local_30);
    cpio->return_value = 1;
    mVar6 = extraout_EAX;
  }
  else {
    if (-1 < (long)cpio->uid_override) {
      archive_entry_set_uid(local_30,(long)cpio->uid_override);
    }
    if (cpio->gname_override != (char *)0x0) {
      archive_entry_set_uname(local_30,cpio->uname_override);
    }
    if (-1 < (long)cpio->gid_override) {
      archive_entry_set_gid(local_30,(long)cpio->gid_override);
    }
    if (cpio->gname_override != (char *)0x0) {
      archive_entry_set_gname(local_30,cpio->gname_override);
    }
    if (cpio->destdir != (char *)0x0) {
      sVar3 = cpio->destdir_len;
      sVar8 = strlen(srcpath);
      uVar9 = sVar8 + sVar3 + 8;
      if (cpio->pass_destpath_alloc <= uVar9) {
        uVar10 = cpio->pass_destpath_alloc;
        if (uVar10 <= uVar9) {
          do {
            uVar10 = uVar10 * 2 + 0x400;
          } while (uVar10 <= uVar9);
          cpio->pass_destpath_alloc = uVar10;
        }
        free(cpio->pass_destpath);
        pcVar7 = (char *)malloc(cpio->pass_destpath_alloc);
        cpio->pass_destpath = pcVar7;
        if (pcVar7 == (char *)0x0) {
          pcVar7 = "Can\'t allocate path buffer";
          iVar5 = 0xc;
          goto LAB_0010b327;
        }
      }
      strcpy(cpio->pass_destpath,cpio->destdir);
      if (((*srcpath == '\\') || (*srcpath == '/')) && ((srcpath[1] == '\\' || (srcpath[1] == '/')))
         ) {
        cVar2 = srcpath[2];
        if (((cVar2 == '?') || (cVar2 == '.')) && ((srcpath[3] == '\\' || (srcpath[3] == '/')))) {
          if (((((cVar2 == '?') && ((byte)(srcpath[4] | 0x20U) == 0x75)) &&
               ((byte)(srcpath[5] | 0x20U) == 0x6e)) && ((byte)(srcpath[6] | 0x20U) == 99)) &&
             ((srcpath[7] == '\\' || (srcpath[7] == '/')))) {
            srcpath = srcpath + 8;
          }
          else {
            srcpath = srcpath + 4;
          }
        }
      }
      do {
        pbVar4 = (byte *)srcpath;
        if ((byte)((*srcpath & 0xdfU) + 0xbf) < 0x1a) {
          pbVar4 = (byte *)srcpath + (ulong)(((byte *)srcpath)[1] == 0x3a) * 2;
        }
        while ((__src = pbVar4, *__src == 0x5c || (*__src == 0x2f))) {
          pbVar1 = __src + 1;
          pbVar4 = pbVar1;
          if ((__src[1] == 0x2e) && (__src[2] == 0x2e)) {
            pbVar4 = __src + 3;
            if ((__src[3] != 0x2f) && (__src[3] != 0x5c)) {
              pbVar4 = pbVar1;
            }
          }
        }
        bVar11 = (byte *)srcpath != __src;
        srcpath = (char *)__src;
      } while (bVar11);
      strcat(cpio->pass_destpath,(char *)__src);
      srcpath = cpio->pass_destpath;
    }
    if (cpio->option_rename != 0) {
      srcpath = cpio_rename(srcpath);
    }
    if (srcpath == (char *)0x0) {
      archive_entry_free(local_30);
      return extraout_EAX_04;
    }
    archive_entry_copy_pathname(local_30,srcpath);
    local_28 = (archive_entry *)0x0;
    mVar6 = extraout_EAX_00;
    if (cpio->linkresolver != (archive_entry_linkresolver *)0x0) {
      mVar6 = archive_entry_filetype(local_30);
      if (mVar6 != 0x4000) {
        archive_entry_linkify(cpio->linkresolver,&local_30,&local_28);
        mVar6 = extraout_EAX_01;
      }
    }
    if (local_30 != (archive_entry *)0x0) {
      entry_to_archive(cpio,local_30);
      archive_entry_free(local_30);
      mVar6 = extraout_EAX_02;
      if (local_28 != (archive_entry *)0x0) {
        entry_to_archive(cpio,local_28);
        archive_entry_free(local_28);
        mVar6 = extraout_EAX_03;
      }
    }
  }
  return mVar6;
}

Assistant:

static int
file_to_archive(struct cpio *cpio, const char *srcpath)
{
	const char *destpath;
	struct archive_entry *entry, *spare;
	size_t len;
	int r;

	/*
	 * Create an archive_entry describing the source file.
	 *
	 */
	entry = archive_entry_new();
	if (entry == NULL)
		lafe_errc(1, 0, "Couldn't allocate entry");
	archive_entry_copy_sourcepath(entry, srcpath);
	r = archive_read_disk_entry_from_file(cpio->archive_read_disk,
	    entry, -1, NULL);
	if (r < ARCHIVE_FAILED)
		lafe_errc(1, 0, "%s",
		    archive_error_string(cpio->archive_read_disk));
	if (r < ARCHIVE_OK)
		lafe_warnc(0, "%s",
		    archive_error_string(cpio->archive_read_disk));
	if (r <= ARCHIVE_FAILED) {
		archive_entry_free(entry);
		cpio->return_value = 1;
		return (r);
	}

	if (cpio->uid_override >= 0)
		archive_entry_set_uid(entry, cpio->uid_override);
	if (cpio->gname_override != NULL)
		archive_entry_set_uname(entry, cpio->uname_override);
	if (cpio->gid_override >= 0)
		archive_entry_set_gid(entry, cpio->gid_override);
	if (cpio->gname_override != NULL)
		archive_entry_set_gname(entry, cpio->gname_override);

	/*
	 * Generate a destination path for this entry.
	 * "destination path" is the name to which it will be copied in
	 * pass mode or the name that will go into the archive in
	 * output mode.
	 */
	destpath = srcpath;
	if (cpio->destdir) {
		len = cpio->destdir_len + strlen(srcpath) + 8;
		if (len >= cpio->pass_destpath_alloc) {
			while (len >= cpio->pass_destpath_alloc) {
				cpio->pass_destpath_alloc += 512;
				cpio->pass_destpath_alloc *= 2;
			}
			free(cpio->pass_destpath);
			cpio->pass_destpath = malloc(cpio->pass_destpath_alloc);
			if (cpio->pass_destpath == NULL)
				lafe_errc(1, ENOMEM,
				    "Can't allocate path buffer");
		}
		strcpy(cpio->pass_destpath, cpio->destdir);
		strcat(cpio->pass_destpath, remove_leading_slash(srcpath));
		destpath = cpio->pass_destpath;
	}
	if (cpio->option_rename)
		destpath = cpio_rename(destpath);
	if (destpath == NULL) {
		archive_entry_free(entry);
		return (0);
	}
	archive_entry_copy_pathname(entry, destpath);

	/*
	 * If we're trying to preserve hardlinks, match them here.
	 */
	spare = NULL;
	if (cpio->linkresolver != NULL
	    && archive_entry_filetype(entry) != AE_IFDIR) {
		archive_entry_linkify(cpio->linkresolver, &entry, &spare);
	}

	if (entry != NULL) {
		r = entry_to_archive(cpio, entry);
		archive_entry_free(entry);
		if (spare != NULL) {
			if (r == 0)
				r = entry_to_archive(cpio, spare);
			archive_entry_free(spare);
		}
	}
	return (r);
}